

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::TransformFeedbackCase
          (TransformFeedbackCase *this,Context *context,char *name,char *desc,deUint32 bufferMode,
          deUint32 primitiveType)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TransformFeedbackCase_00d260f0;
  (this->m_progSpec).m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_progSpec).m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_progSpec).m_structs.
  super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_progSpec).m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_progSpec).m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_progSpec).m_varyings.
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Varying,_std::allocator<deqp::gles3::Functional::TransformFeedback::Varying>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_progSpec).m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_progSpec).m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_progSpec).m_transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_bufferMode = bufferMode;
  this->m_primitiveType = primitiveType;
  this->m_inputStride = 0;
  (this->m_attributes).
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attributes).
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_attributes).
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_transformFeedbackOutputs).
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transformFeedbackOutputs).
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_transformFeedbackOutputs).
  super__Vector_base<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_bufferStrides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_transformFeedback = (TransformFeedback *)0x0;
  (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outputBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_iterNdx = 0;
  return;
}

Assistant:

TransformFeedbackCase::TransformFeedbackCase (Context& context, const char* name, const char* desc, deUint32 bufferMode, deUint32 primitiveType)
	: TestCase				(context, name, desc)
	, m_bufferMode			(bufferMode)
	, m_primitiveType		(primitiveType)
	, m_inputStride			(0)
	, m_program				(DE_NULL)
	, m_transformFeedback	(DE_NULL)
	, m_iterNdx				(0)
{
}